

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_ObjSetdownSimInfo(Abc_Obj_t *pObj)

{
  int iVar1;
  Sfm_Dec_t *p_00;
  word wVar2;
  word *pwVar3;
  ulong uVar4;
  word uMask;
  word uSims [2];
  ulong local_30;
  word uSim;
  int d;
  int c;
  Sfm_Dec_t *p;
  int nPatKeep;
  Abc_Obj_t *pObj_local;
  
  p_00 = Sfm_DecMan(pObj);
  if (p_00->pPars->fUseSim != 0) {
    for (uSim._0_4_ = 0; (int)uSim < p_00->nDivs; uSim._0_4_ = (int)uSim + 1) {
      iVar1 = Vec_IntEntry(&p_00->vObjMap,(int)uSim);
      local_30 = Vec_WrdEntry(&p_00->vObjSims,iVar1);
      for (uSim._4_4_ = 0; uSim._4_4_ < 2; uSim._4_4_ = uSim._4_4_ + 1) {
        iVar1 = Abc_MinInt(p_00->nPats[uSim._4_4_],0x20);
        wVar2 = Abc_Tt6Mask(iVar1);
        pwVar3 = Sfm_DecDivPats(p_00,(int)uSim,uSim._4_4_);
        uSims[(long)uSim._4_4_ + -1] = *pwVar3 & wVar2 | local_30 & (wVar2 ^ 0xffffffffffffffff);
        local_30 = local_30 >> 0x20;
      }
      uVar4 = uSims[0] << 0x20;
      iVar1 = Vec_IntEntry(&p_00->vObjMap,(int)uSim);
      Vec_WrdWriteEntry(&p_00->vObjSims,iVar1,uMask & 0xffffffff | uVar4);
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetdownSimInfo( Abc_Obj_t * pObj )
{
    int nPatKeep = 32;
    Sfm_Dec_t * p = Sfm_DecMan( pObj );
    int c, d; word uSim, uSims[2], uMask;
    if ( !p->pPars->fUseSim )
        return;
    for ( d = 0; d < p->nDivs; d++ )
    {
        uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
        for ( c = 0; c < 2; c++ )
        {
            uMask = Abc_Tt6Mask( Abc_MinInt(p->nPats[c], nPatKeep) );
            uSims[c] = (Sfm_DecDivPats(p, d, c)[0] & uMask) | (uSim & ~uMask);
            uSim >>= 32;
        }
        uSim = (uSims[0] & 0xFFFFFFFF) | (uSims[1] << 32);
        Vec_WrdWriteEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d), uSim );
    }
}